

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCommonEdgeTests.cpp
# Opt level: O0

bool vkt::tessellation::anon_unknown_2::verifyResult(TestLog *log,ConstPixelBufferAccess *image)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  MessageBuilder *pMVar5;
  TestLog *this;
  float fVar6;
  MessageBuilder local_4e0;
  Vector<int,_2> local_35c [2];
  MessageBuilder local_348;
  MessageBuilder local_1c8;
  undefined1 local_48 [8];
  Vec4 pixel;
  int x;
  int y;
  int endY;
  int startY;
  int endX;
  int startX;
  ConstPixelBufferAccess *image_local;
  TestLog *log_local;
  
  iVar1 = tcu::ConstPixelBufferAccess::getWidth(image);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(image);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(image);
  iVar4 = tcu::ConstPixelBufferAccess::getHeight(image);
  pixel.m_data[3] = (float)(int)((float)iVar3 * 0.15);
  do {
    fVar6 = (float)(int)((float)iVar1 * 0.15);
    if ((int)((float)iVar4 * 0.85) <= (int)pixel.m_data[3]) {
      tcu::TestLog::operator<<(&local_4e0,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_4e0,
                          (char (*) [59])
                          "Success: there seem to be no cracks in the rendered result");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4e0);
      return true;
    }
    while (pixel.m_data[2] = fVar6, (int)pixel.m_data[2] < (int)((float)iVar2 * 0.85)) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_48,(int)image,(int)pixel.m_data[2],
                 (int)pixel.m_data[3]);
      fVar6 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_48);
      if ((fVar6 == 0.0) && (!NAN(fVar6))) {
        fVar6 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_48);
        if ((fVar6 == 0.0) && (!NAN(fVar6))) {
          fVar6 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_48);
          if ((fVar6 == 0.0) && (!NAN(fVar6))) {
            tcu::TestLog::operator<<(&local_348,log,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar5 = tcu::MessageBuilder::operator<<
                               (&local_348,
                                (char (*) [56])
                                "Failure: there seem to be cracks in the rendered result");
            this = tcu::MessageBuilder::operator<<
                             (pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::TestLog::operator<<(&local_1c8,this,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar5 = tcu::MessageBuilder::operator<<
                               (&local_1c8,
                                (char (*) [52])"Note: pixel with zero r, g and b channels found at "
                               );
            tcu::Vector<int,_2>::Vector(local_35c,(int)pixel.m_data[2],(int)pixel.m_data[3]);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_35c);
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_1c8);
            tcu::MessageBuilder::~MessageBuilder(&local_348);
            return false;
          }
        }
      }
      fVar6 = (float)((int)pixel.m_data[2] + 1);
    }
    pixel.m_data[3] = (float)((int)pixel.m_data[3] + 1);
  } while( true );
}

Assistant:

bool verifyResult (tcu::TestLog& log, const tcu::ConstPixelBufferAccess image)
{
	const int startX = static_cast<int>(0.15f * (float)image.getWidth());
	const int endX	 = static_cast<int>(0.85f * (float)image.getWidth());
	const int startY = static_cast<int>(0.15f * (float)image.getHeight());
	const int endY	 = static_cast<int>(0.85f * (float)image.getHeight());

	for (int y = startY; y < endY; ++y)
	for (int x = startX; x < endX; ++x)
	{
		const tcu::Vec4 pixel = image.getPixel(x, y);

		if (pixel.x() == 0 && pixel.y() == 0 && pixel.z() == 0)
		{
			log << tcu::TestLog::Message << "Failure: there seem to be cracks in the rendered result" << tcu::TestLog::EndMessage
				<< tcu::TestLog::Message << "Note: pixel with zero r, g and b channels found at " << tcu::IVec2(x, y) << tcu::TestLog::EndMessage;

			return false;
		}
	}

	log << tcu::TestLog::Message << "Success: there seem to be no cracks in the rendered result" << tcu::TestLog::EndMessage;

	return true;
}